

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-bind-error.c
# Opt level: O2

int run_test_tcp_bind_error_addrnotavail_2(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  char *pcVar5;
  int64_t eval_b;
  int64_t eval_b_1;
  sockaddr_in addr;
  uv_tcp_t server;
  
  iVar1 = uv_ip4_addr("4.4.4.4",0x23a3,&addr);
  eval_b = (int64_t)iVar1;
  server.data = (void *)eval_b;
  if ((void *)eval_b == (void *)0x0) {
    puVar2 = uv_default_loop();
    iVar1 = uv_tcp_init(puVar2,&server);
    eval_b = (int64_t)iVar1;
    eval_b_1 = 0;
    if ((void *)eval_b == (void *)0x0) {
      iVar1 = uv_tcp_bind(&server,(sockaddr *)&addr,0);
      eval_b = (int64_t)iVar1;
      eval_b_1 = -99;
      if ((void *)eval_b == (void *)0xffffffffffffff9d) {
        uv_close((uv_handle_t *)&server,close_cb);
        puVar2 = uv_default_loop();
        uv_run(puVar2,UV_RUN_DEFAULT);
        eval_b = 1;
        eval_b_1 = (int64_t)close_cb_called;
        if (eval_b_1 == 1) {
          puVar2 = uv_default_loop();
          close_loop(puVar2);
          eval_b = 0;
          puVar2 = uv_default_loop();
          iVar1 = uv_loop_close(puVar2);
          eval_b_1 = (int64_t)iVar1;
          if (eval_b_1 == 0) {
            uv_library_shutdown();
            return 0;
          }
          pcVar5 = "uv_loop_close(uv_default_loop())";
          pcVar4 = "0";
          uVar3 = 0x9c;
        }
        else {
          pcVar5 = "close_cb_called";
          pcVar4 = "1";
          uVar3 = 0x9a;
        }
      }
      else {
        pcVar5 = "UV_EADDRNOTAVAIL";
        pcVar4 = "r";
        uVar3 = 0x94;
      }
    }
    else {
      pcVar5 = "0";
      pcVar4 = "r";
      uVar3 = 0x92;
    }
  }
  else {
    pcVar5 = "0";
    pcVar4 = "uv_ip4_addr(\"4.4.4.4\", 9123, &addr)";
    uVar3 = 0x8f;
    eval_b_1 = 0;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-bind-error.c"
          ,uVar3,pcVar4,"==",pcVar5,eval_b,"==",eval_b_1);
  abort();
}

Assistant:

TEST_IMPL(tcp_bind_error_addrnotavail_2) {
  struct sockaddr_in addr;
  uv_tcp_t server;
  int r;

  ASSERT_OK(uv_ip4_addr("4.4.4.4", TEST_PORT, &addr));

  r = uv_tcp_init(uv_default_loop(), &server);
  ASSERT_OK(r);
  r = uv_tcp_bind(&server, (const struct sockaddr*) &addr, 0);
  ASSERT_EQ(r, UV_EADDRNOTAVAIL);

  uv_close((uv_handle_t*)&server, close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}